

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfloat.hpp
# Opt level: O2

bool operator==(mat4f *a,mat4f *b)

{
  float *pfVar1;
  float fVar2;
  
  fVar2 = a->data[0][0];
  if ((((((((fVar2 == b->data[0][0]) && (!NAN(fVar2) && !NAN(b->data[0][0]))) &&
          (fVar2 = a->data[0][1], pfVar1 = b->data[0] + 1, fVar2 == *pfVar1)) &&
         (((!NAN(fVar2) && !NAN(*pfVar1) &&
           (fVar2 = a->data[0][2], pfVar1 = b->data[0] + 2, fVar2 == *pfVar1)) &&
          ((!NAN(fVar2) && !NAN(*pfVar1) &&
           ((fVar2 = a->data[0][3], pfVar1 = b->data[0] + 3, fVar2 == *pfVar1 &&
            (!NAN(fVar2) && !NAN(*pfVar1))))))))) && (fVar2 = a->data[1][0], fVar2 == b->data[1][0])
        ) && (((!NAN(fVar2) && !NAN(b->data[1][0]) &&
               (fVar2 = a->data[1][1], pfVar1 = b->data[1] + 1, fVar2 == *pfVar1)) &&
              (!NAN(fVar2) && !NAN(*pfVar1))))) &&
      (((fVar2 = a->data[1][2], pfVar1 = b->data[1] + 2, fVar2 == *pfVar1 &&
        (!NAN(fVar2) && !NAN(*pfVar1))) &&
       ((fVar2 = a->data[1][3], pfVar1 = b->data[1] + 3, fVar2 == *pfVar1 &&
        ((!NAN(fVar2) && !NAN(*pfVar1) && (fVar2 = a->data[2][0], fVar2 == b->data[2][0])))))))) &&
     (((!NAN(fVar2) && !NAN(b->data[2][0]) &&
       (((((fVar2 = a->data[2][1], pfVar1 = b->data[2] + 1, fVar2 == *pfVar1 &&
           (!NAN(fVar2) && !NAN(*pfVar1))) &&
          (fVar2 = a->data[2][2], pfVar1 = b->data[2] + 2, fVar2 == *pfVar1)) &&
         ((!NAN(fVar2) && !NAN(*pfVar1) &&
          (fVar2 = a->data[2][3], pfVar1 = b->data[2] + 3, fVar2 == *pfVar1)))) &&
        ((!NAN(fVar2) && !NAN(*pfVar1) &&
         ((fVar2 = a->data[3][0], fVar2 == b->data[3][0] && (!NAN(fVar2) && !NAN(b->data[3][0]))))))
        ))) && ((fVar2 = a->data[3][1], pfVar1 = b->data[3] + 1, fVar2 == *pfVar1 &&
                (((!NAN(fVar2) && !NAN(*pfVar1) &&
                  (fVar2 = a->data[3][2], pfVar1 = b->data[3] + 2, fVar2 == *pfVar1)) &&
                 (!NAN(fVar2) && !NAN(*pfVar1))))))))) {
    return (bool)(-(b->data[3][3] == a->data[3][3]) & 1);
  }
  return false;
}

Assistant:

inline bool operator == (const mat4f& a, const mat4f& b) {
	return a[0][0]==b[0][0] &&
		a[0][1]==b[0][1] &&
		a[0][2]==b[0][2] &&
		a[0][3]==b[0][3] &&
		a[1][0]==b[1][0] &&
		a[1][1]==b[1][1] &&
		a[1][2]==b[1][2] &&
		a[1][3]==b[1][3] &&
		a[2][0]==b[2][0] &&
		a[2][1]==b[2][1] &&
		a[2][2]==b[2][2] &&
		a[2][3]==b[2][3] &&
		a[3][0]==b[3][0] &&
		a[3][1]==b[3][1] &&
		a[3][2]==b[3][2] &&
		a[3][3]==b[3][3];
}